

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool log_iter_next(hdr_iter *iter)

{
  _Bool _Var1;
  int64_t iVar2;
  hdr_iter_log *logarithmic;
  hdr_iter *iter_local;
  
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  _Var1 = has_next(iter);
  if ((_Var1) ||
     (_Var1 = next_value_greater_than_reporting_level_upper_bound
                        (iter,(iter->specifics).linear.next_value_reporting_level_lowest_equivalent)
     , _Var1)) {
    while (iter->value < (iter->specifics).linear.next_value_reporting_level_lowest_equivalent) {
      _Var1 = move_next(iter);
      if (!_Var1) {
        return true;
      }
      (iter->specifics).linear.count_added_in_this_iteration_step =
           iter->count + (iter->specifics).linear.count_added_in_this_iteration_step;
    }
    update_iterated_values(iter,(iter->specifics).linear.next_value_reporting_level);
    (iter->specifics).linear.next_value_reporting_level =
         (long)(iter->specifics).log.log_base * (iter->specifics).linear.next_value_reporting_level;
    iVar2 = lowest_equivalent_value(iter->h,(iter->specifics).linear.next_value_reporting_level);
    (iter->specifics).linear.next_value_reporting_level_lowest_equivalent = iVar2;
    iter_local._7_1_ = true;
  }
  else {
    iter_local._7_1_ = false;
  }
  return iter_local._7_1_;
}

Assistant:

static bool log_iter_next(struct hdr_iter *iter)
{
    struct hdr_iter_log* logarithmic = &iter->specifics.log;

    logarithmic->count_added_in_this_iteration_step = 0;

    if (has_next(iter) ||
        next_value_greater_than_reporting_level_upper_bound(
            iter, logarithmic->next_value_reporting_level_lowest_equivalent))
    {
        do
        {
            if (iter->value >= logarithmic->next_value_reporting_level_lowest_equivalent)
            {
                update_iterated_values(iter, logarithmic->next_value_reporting_level);

                logarithmic->next_value_reporting_level *= (int64_t)logarithmic->log_base;
                logarithmic->next_value_reporting_level_lowest_equivalent = lowest_equivalent_value(iter->h, logarithmic->next_value_reporting_level);

                return true;
            }

            if (!move_next(iter))
            {
                return true;
            }

            logarithmic->count_added_in_this_iteration_step += iter->count;
        }
        while (true);
    }

    return false;
}